

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O0

int si9ma::Trie::prefix_search(TrieNode *root,string *str)

{
  ulong uVar1;
  char *pcVar2;
  int local_2c;
  int index;
  int i;
  TrieNode *cur;
  string *str_local;
  TrieNode *root_local;
  
  local_2c = 0;
  _index = root;
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (uVar1 <= (ulong)(long)local_2c) {
      return _index->pass;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if (_index->nexts[*pcVar2 + -0x61] == (TrieNode *)0x0) break;
    _index = _index->nexts[*pcVar2 + -0x61];
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Trie::prefix_search(TrieNode *root,const string &str) {
        auto *cur = root;

        for (int i = 0; i < str.length(); ++i) {
            int index = str[i] - 'a';

            if (cur->nexts[index] == nullptr)
                return 0;

            cur = cur->nexts[index];
        }

        return cur->pass;
    }